

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

bool __thiscall
libcellml::Importer::removeImportSource(Importer *this,ImportSourcePtr *importSource)

{
  shared_ptr<libcellml::ImportSource> *psVar1;
  ImporterImpl *this_00;
  const_iterator __position;
  LoggerImpl *pLVar2;
  
  this_00 = (ImporterImpl *)Logger::pFunc(&this->super_Logger);
  __position = ImporterImpl::findImportSource(this_00,importSource);
  pLVar2 = Logger::pFunc(&this->super_Logger);
  psVar1 = (shared_ptr<libcellml::ImportSource> *)
           pLVar2[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (__position._M_current != psVar1) {
    pLVar2 = Logger::pFunc(&this->super_Logger);
    std::
    vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
    ::_M_erase((vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
                *)&pLVar2[1].mMessages.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(iterator)__position._M_current);
  }
  return __position._M_current != psVar1;
}

Assistant:

bool Importer::removeImportSource(const ImportSourcePtr &importSource)
{
    bool status = false;
    auto result = pFunc()->findImportSource(importSource);
    if (result != pFunc()->mImports.end()) {
        pFunc()->mImports.erase(result);
        status = true;
    }
    return status;
}